

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evmap.c
# Opt level: O1

int evmap_signal_add_(event_base *base,int sig,event *ev)

{
  event_signal_map *map;
  eventop *peVar1;
  undefined8 *puVar2;
  event **ppeVar3;
  event *peVar4;
  int iVar5;
  void *pvVar6;
  
  iVar5 = -1;
  if ((uint)sig < 0x41) {
    peVar1 = base->evsigsel;
    map = &base->sigmap;
    if (((base->sigmap).nentries <= sig) && (iVar5 = evmap_make_space(map,sig,(int)ev), iVar5 == -1)
       ) {
      return -1;
    }
    if (map->entries[(uint)sig] == (void *)0x0) {
      pvVar6 = event_mm_calloc_(1,base->evsigsel->fdinfo_len + 8);
      (base->sigmap).entries[(uint)sig] = pvVar6;
      puVar2 = (undefined8 *)(base->sigmap).entries[(uint)sig];
      if (puVar2 == (undefined8 *)0x0) {
        return -1;
      }
      *puVar2 = 0;
    }
    ppeVar3 = (event **)map->entries[(uint)sig];
    if ((*ppeVar3 == (event *)0x0) &&
       (iVar5 = (*peVar1->add)(base,ev->ev_fd,0,8,(void *)0x0), iVar5 == -1)) {
      return -1;
    }
    peVar4 = *ppeVar3;
    (ev->ev_).ev_io.ev_io_next.le_next = peVar4;
    if (peVar4 != (event *)0x0) {
      ((*ppeVar3)->ev_).ev_io.ev_io_next.le_prev = (event **)&ev->ev_;
    }
    *ppeVar3 = ev;
    (ev->ev_).ev_io.ev_io_next.le_prev = ppeVar3;
    iVar5 = 1;
  }
  return iVar5;
}

Assistant:

int
evmap_signal_add_(struct event_base *base, int sig, struct event *ev)
{
	const struct eventop *evsel = base->evsigsel;
	struct event_signal_map *map = &base->sigmap;
	struct evmap_signal *ctx = NULL;

	if (sig < 0 || sig >= NSIG)
		return (-1);

	if (sig >= map->nentries) {
		if (evmap_make_space(
			map, sig, sizeof(struct evmap_signal *)) == -1)
			return (-1);
	}
	GET_SIGNAL_SLOT_AND_CTOR(ctx, map, sig, evmap_signal, evmap_signal_init,
	    base->evsigsel->fdinfo_len);

	if (LIST_EMPTY(&ctx->events)) {
		if (evsel->add(base, ev->ev_fd, 0, EV_SIGNAL, NULL)
		    == -1)
			return (-1);
	}

	LIST_INSERT_HEAD(&ctx->events, ev, ev_signal_next);

	return (1);
}